

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

bool __thiscall ON_Layer::Write(ON_Layer *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool b;
  bool bVar2;
  Type component_type;
  ON_3dmArchiveTableType OVar3;
  int iVar4;
  ON__UINT32 OVar5;
  uint uVar6;
  wchar_t *pwVar7;
  ON_ComponentManifest *pOVar8;
  ON_ComponentManifestItem *this_00;
  ON_UUID *pOVar9;
  ON_SectionStyle *pOVar10;
  ON_SectionStyle *section_style;
  uchar c;
  ON_UUID parent_layer_id;
  undefined1 local_a50 [8];
  ON_NameHash sublayer_name_hash;
  ON_wString sublayer_name;
  int attempt_count;
  ON_RandomNumberGenerator rng;
  ON__UINT16 hash;
  undefined8 uStack_48;
  ON_UUID parent_layer_id_1;
  undefined1 local_30 [8];
  ON_wString name;
  bool local_1d;
  ON__INT32 OStack_1c;
  short s;
  bool bLocked;
  bool bVisible;
  bool rc;
  int i;
  ON_BinaryArchive *file_local;
  ON_Layer *this_local;
  
  local_1d = ON_BinaryArchive::Write3dmChunkVersion(file,1,0xf);
  if (local_1d) {
    bVar1 = PersistentVisibility(this);
    b = PersistentLocking(this);
    if (bVar1) {
      OStack_1c = 0;
    }
    else if (b) {
      OStack_1c = 2;
    }
    else {
      OStack_1c = 1;
    }
    local_1d = ON_BinaryArchive::WriteInt(file,OStack_1c);
    if (((((local_1d) &&
          (local_1d = ON_BinaryArchive::Write3dmReferencedComponentIndex
                                (file,&this->super_ON_ModelComponent), local_1d)) &&
         (local_1d = ON_BinaryArchive::WriteInt(file,this->m_iges_level), local_1d)) &&
        ((local_1d = ON_BinaryArchive::Write3dmReferencedComponentIndex
                               (file,Material,this->m_material_index), local_1d &&
         (local_1d = ON_BinaryArchive::WriteInt(file,0), local_1d)))) &&
       (local_1d = ON_BinaryArchive::WriteColor(file,&this->m_color), local_1d)) {
      name.m_s._6_2_ = 0;
      if (local_1d) {
        local_1d = ON_BinaryArchive::WriteShort(file,0);
      }
      if (local_1d != false) {
        local_1d = ON_BinaryArchive::WriteShort(file,name.m_s._6_2_);
      }
      if (local_1d != false) {
        local_1d = ON_BinaryArchive::WriteDouble(file,0.0);
      }
      if (local_1d != false) {
        local_1d = ON_BinaryArchive::WriteDouble(file,1.0);
      }
      if (local_1d != false) {
        OVar3 = ON_BinaryArchive::Active3dmTable(file);
        if (((OVar3 == layer_table) &&
            (iVar4 = ON_BinaryArchive::Archive3dmVersion(file), iVar4 < 5)) &&
           ((bVar2 = ON_ModelComponent::NameIsNotEmpty(&this->super_ON_ModelComponent), bVar2 &&
            (bVar2 = ON_ModelComponent::ParentIdIsNotNil(&this->super_ON_ModelComponent), bVar2))))
        {
          ON_ModelComponent::Name((ON_ModelComponent *)local_30);
          pOVar9 = ON_ModelComponent::ParentId(&this->super_ON_ModelComponent);
          uStack_48._0_4_ = pOVar9->Data1;
          uStack_48._4_2_ = pOVar9->Data2;
          uStack_48._6_2_ = pOVar9->Data3;
          parent_layer_id_1._0_8_ = *(undefined8 *)pOVar9->Data4;
          rng.m_rand_context.mt[0x26e]._2_2_ = ON_CRC16(0,0x10,&uStack_48);
          ON_RandomNumberGenerator::ON_RandomNumberGenerator
                    ((ON_RandomNumberGenerator *)((long)&sublayer_name.m_s + 4));
          ON_RandomNumberGenerator::Seed
                    ((ON_RandomNumberGenerator *)((long)&sublayer_name.m_s + 4),
                     (uint)rng.m_rand_context.mt[0x26e]._2_2_);
          for (sublayer_name.m_s._0_4_ = 0; (int)sublayer_name.m_s < 100;
              sublayer_name.m_s._0_4_ = (int)sublayer_name.m_s + 1) {
            while (rng.m_rand_context.mt[0x26e]._2_2_ == 0) {
              OVar5 = ON_RandomNumberGenerator::RandomNumber
                                ((ON_RandomNumberGenerator *)((long)&sublayer_name.m_s + 4));
              rng.m_rand_context.mt[0x26e]._2_2_ = (ON__UINT16)((ulong)OVar5 % 0xffff);
            }
            ON_wString::ON_wString((ON_wString *)sublayer_name_hash.m_parent_id.Data4);
            pwVar7 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_30);
            ON_wString::Format((ON_wString *)sublayer_name_hash.m_parent_id.Data4,L"%ls (%04x)",
                               pwVar7,(ulong)rng.m_rand_context.mt[0x26e]._2_2_);
            ON_NameHash::Create((ON_NameHash *)local_a50,&ON_nil_uuid,
                                (ON_wString *)sublayer_name_hash.m_parent_id.Data4);
            pOVar8 = ON_BinaryArchive::Manifest(file);
            component_type = ON_ModelComponent::ComponentType(&this->super_ON_ModelComponent);
            this_00 = ON_ComponentManifest::ItemFromNameHash
                                (pOVar8,component_type,(ON_NameHash *)local_a50);
            bVar2 = ON_ComponentManifestItem::IsUnset(this_00);
            if (bVar2) {
              ON_wString::operator=
                        ((ON_wString *)local_30,(ON_wString *)sublayer_name_hash.m_parent_id.Data4);
              pOVar8 = ON_BinaryArchive::Manifest(file);
              pOVar9 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
              parent_layer_id.Data4._4_4_ = pOVar9->Data1;
              unique0x10000518 = pOVar9->Data2;
              unique0x1000051a = pOVar9->Data3;
              ON_ComponentManifest::ChangeComponentNameHash(pOVar8,*pOVar9,(ON_NameHash *)local_a50)
              ;
              parent_layer_id.Data4[0] = '\x04';
              parent_layer_id.Data4[1] = '\0';
              parent_layer_id.Data4[2] = '\0';
              parent_layer_id.Data4[3] = '\0';
            }
            else {
              OVar5 = ON_RandomNumberGenerator::RandomNumber
                                ((ON_RandomNumberGenerator *)((long)&sublayer_name.m_s + 4));
              rng.m_rand_context.mt[0x26e]._2_2_ = (ON__UINT16)((ulong)OVar5 % 0xffff);
              parent_layer_id.Data4[0] = '\0';
              parent_layer_id.Data4[1] = '\0';
              parent_layer_id.Data4[2] = '\0';
              parent_layer_id.Data4[3] = '\0';
            }
            ON_wString::~ON_wString((ON_wString *)sublayer_name_hash.m_parent_id.Data4);
            if (parent_layer_id.Data4._0_4_ != 0) break;
          }
          local_1d = ON_BinaryArchive::WriteString(file,(ON_wString *)local_30);
          ON_wString::~ON_wString((ON_wString *)local_30);
        }
        else {
          local_1d = ON_BinaryArchive::WriteModelComponentName(file,&this->super_ON_ModelComponent);
        }
        if ((((local_1d != false) && (local_1d = ON_BinaryArchive::WriteBool(file,bVar1), local_1d))
            && (local_1d = ON_BinaryArchive::Write3dmReferencedComponentIndex
                                     (file,LinePattern,this->m_linetype_index), local_1d)) &&
           (((local_1d = ON_BinaryArchive::WriteColor(file,&this->m_plot_color), local_1d &&
             (local_1d = ON_BinaryArchive::WriteDouble(file,this->m_plot_weight_mm), local_1d)) &&
            (local_1d = ON_BinaryArchive::WriteBool(file,b), local_1d)))) {
          pOVar9 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
          local_1d = ON_BinaryArchive::WriteUuid(file,pOVar9);
          if (local_1d) {
            join_0x00000010_0x00000000_ = ParentLayerId(this);
            local_1d = ON_BinaryArchive::WriteUuid(file,(ON_UUID *)((long)&section_style + 4));
            if (((local_1d) &&
                (local_1d = ON_BinaryArchive::WriteBool(file,(bool)(this->m_bExpanded & 1)),
                local_1d)) &&
               ((local_1d = ON_RenderingAttributes::Write(&this->m_rendering_attributes,file),
                local_1d &&
                (local_1d = ON_BinaryArchive::WriteUuid(file,&this->m_display_material_id), local_1d
                )))) {
              section_style._3_1_ = 0;
              pOVar10 = CustomSectionStyle(this,(ON_SectionStyle *)0x0);
              bVar1 = PerViewportIsVisibleInNewDetails(this);
              if (!bVar1) {
                section_style._3_1_ = 0x22;
                bVar1 = ON_BinaryArchive::WriteChar(file,'\"');
                if (!bVar1) {
                  return bVar1;
                }
                bVar1 = PerViewportIsVisibleInNewDetails(this);
                bVar1 = ON_BinaryArchive::WriteBool(file,bVar1);
                if (!bVar1) {
                  return bVar1;
                }
              }
              if (pOVar10 != (ON_SectionStyle *)0x0) {
                section_style._3_1_ = 0x23;
                bVar1 = ON_BinaryArchive::WriteChar(file,'#');
                if (!bVar1) {
                  return bVar1;
                }
                uVar6 = (*(pOVar10->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[10])
                                  (pOVar10,file);
                if ((uVar6 & 1) == 0) {
                  return (bool)((byte)uVar6 & 1);
                }
              }
              section_style._3_1_ = 0;
              local_1d = ON_BinaryArchive::WriteChar(file,'\0');
            }
          }
        }
      }
    }
  }
  return local_1d;
}

Assistant:

bool ON_Layer::Write(
       ON_BinaryArchive& file // serialize definition to binary archive
     ) const
{
  int i;

  // 11 May 2023 S. Baer
  // Do not write a minor chunk version greater than 15. Chunk versions are actually
  // two values packed into a single unsigned char. The use of type codes for I/O
  // with layers makes it so the minor version isn't really necessary. Just stop at
  // a minor version of 15
  bool rc = file.Write3dmChunkVersion(1,15);
  while(rc)
  {
    // Save the visibility state this layer has when its parent
    // is visible ignoring current parent visibility value.
    bool bVisible = PersistentVisibility();

    // Save the locked state this layer has when its parent
    // is unlocked ignoring current parenting locked setting.
    const bool bLocked = PersistentLocking();

    // Save OBSOLETE mode value so we don't break file format
    if ( bVisible )
      i = 0; // "normal" layer mode
    else if ( bLocked )
      i = 2; // "locked" layer mode
    else
      i = 1; // "hidden" layer mode

    rc = file.WriteInt( i );
    if (!rc) break;

    rc = file.Write3dmReferencedComponentIndex( *this );
    if (!rc) break;

    rc = file.WriteInt( m_iges_level );
    if (!rc) break;

    rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::RenderMaterial, m_material_index );
    if (!rc) break;

    // Starting with version 200312110, this value is zero.  For files written
    // with earlier versions, the number was a "model index" value that was
    // set to something >= 1, but never used.  We have to continue to 
    // read/write an integer here so that old/new versions of opennurbs can
    // read files written by new/old versions.
    i = 0;
    rc = file.WriteInt( i );
    if (!rc) break;

    rc = file.WriteColor( m_color );
    if (!rc) break;
    
    {
      // OBSOLETE LINE STYLE if ( rc ) rc = file.WriteLineStyle( LineStyle() );
      // Starting with version 200503170, this section is "officially" not used.
      // Prior to that, it was old ON_LineStyle information that has
      // never been used.
      short s = 0;
      if (rc) rc = file.WriteShort(s);    // default pattern
      if (rc) rc = file.WriteShort(s);    // default pattern index
      if (rc) rc = file.WriteDouble(0.0); // default thickness
      if (rc) rc = file.WriteDouble(1.0); // default scale
    }
    if (!rc) break;

    if (
      file.Active3dmTable() == ON_3dmArchiveTableType::layer_table
      && file.Archive3dmVersion() <= 4
      && NameIsNotEmpty()
      && ParentIdIsNotNil()
      )
    {
      ON_wString name = Name();
      // In V4 there are no parent layers and all V4 layer names must be unique.
      // Since layers can be written in any order, we cannot know if there will
      // eventually be a parent layer using the same name as this child layer.
      // So, child layer names get a hash appended to insure they are unique.
      ON_UUID parent_layer_id = ParentId();
      ON__UINT16 hash = ON_CRC16(0, sizeof(parent_layer_id), &parent_layer_id);
      ON_RandomNumberGenerator rng;
      rng.Seed(hash);
      for (int attempt_count = 0; attempt_count < 100; attempt_count++)
      {
        while ( 0 == hash )
          hash = (ON__UINT16)(rng.RandomNumber() % 0xFFFFU);
        ON_wString sublayer_name;
        sublayer_name.Format(L"%ls (%04x)", static_cast<const wchar_t*>(name),hash);
        
        // Use ON_nil_uuid ast the parent id because we need a name that is uniques
        // as a "top level" layer name for V4 files.
        const ON_NameHash sublayer_name_hash = ON_NameHash::Create(ON_nil_uuid,sublayer_name);

        if ( file.Manifest().ItemFromNameHash(ComponentType(), sublayer_name_hash).IsUnset() )
        {
          // have a unique name
          name = sublayer_name;
          const_cast< ON_ComponentManifest& >(file.Manifest()).ChangeComponentNameHash(Id(), sublayer_name_hash);
          break;
        }
        hash = (ON__UINT16)(rng.RandomNumber() % 0xFFFFU);
      }
      rc = file.WriteString( name );
    }
    else
    {
      rc = file.WriteModelComponentName(*this);
    }

    if (!rc) break;

    // 1.1 fields
    rc = file.WriteBool(bVisible);
    if (!rc) break;

    // 1.2 field
    rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::LinePattern, m_linetype_index );
    if (!rc) break;

    // 1.3 field - 23 March 2005 Dale Lear
    rc = file.WriteColor( m_plot_color);
    if (!rc) break;
    rc = file.WriteDouble( m_plot_weight_mm);
    if (!rc) break;

    // 1.4 field - 3 May 2005 Dale Lear 
    //           - locked and visible are independent settings
    rc = file.WriteBool( bLocked );
    if (!rc) break;

    // 1.5 field
    rc = file.WriteUuid( Id() );
    if (!rc) break;

    // 1.6 field
    ON_UUID parent_layer_id = ParentLayerId();
    rc = file.WriteUuid( parent_layer_id );
    if (!rc) break;

    // 1.6 field
    rc = file.WriteBool( m_bExpanded );
    if (!rc) break;

    // 1.7 field - added 6 June 2006
    rc = m_rendering_attributes.Write(file);
    if (!rc) break;

    // 1.8 field - added 19 Sep 2006
    rc = file.WriteUuid(m_display_material_id);
    if (!rc) break;

    // 1.10 field - added 29 Sep 2021
    // using ON_3dmObjectAttributes inspired technique for writing only
    // non-default values to 3dm files
    unsigned char c = 0;

    // selective clipping (1.10)
    //{
    //  bool forAllClippingPlanes = true;
    //  bool forNoClippingPlanes = false;
    //  ON_UuidList selectiveList;
    //  bool isParticipationList = true;
    //  GetClipParticipation(forAllClippingPlanes, forNoClippingPlanes, selectiveList, isParticipationList);
    //  // only write selective clipping data if it is not default
    //  if (false == forAllClippingPlanes || true == forNoClippingPlanes || selectiveList.Count() > 0)
    //  {
    //    c = ON_LayerTypeCodes::SelectiveClippingData;
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.WriteBool(forNoClippingPlanes);
    //    if (!rc) break;
    //    rc = selectiveList.Write(file);
    //    if (!rc) break;
    //  }
    //}

    // 23 April 2023 S. Baer
    // Stop writing individual section attributes. All section attribute IO has been
    // moved to writing an ON_SectionStyle instance
    // section hatch (1.11)
    const ON_SectionStyle* section_style = CustomSectionStyle();
    //if (section_style)
    //{
    //  if (section_style->HatchIndex() != ON_UNSET_INT_INDEX)
    //  {
    //    c = ON_LayerTypeCodes::SectionHatchIndex;
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.Write3dmReferencedComponentIndex(ON_ModelComponent::Type::HatchPattern, section_style->HatchIndex());
    //    if (!rc) break;
    //  }
    //  if (section_style->HatchScale() != 1.0)
    //  {
    //    c = ON_LayerTypeCodes::SectionHatchScale;
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.WriteDouble(section_style->HatchScale());
    //    if (!rc) break;
    //  }
    //  if (section_style->HatchRotation() != 0.0)
    //  {
    //    c = ON_LayerTypeCodes::SectionHatchRotation;
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.WriteDouble(section_style->HatchRotation());
    //    if (!rc) break;
    //  }

    //  // section fill (1.12)
    //  if (section_style->SectionFillRule() != ON::SectionFillRule::ClosedCurves)
    //  {
    //    c = ON_LayerTypeCodes::SectionFillRule; //32
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.WriteChar((unsigned char)section_style->SectionFillRule());
    //    if (!rc) break;
    //  }
    //}

    // custom linetype (1.13)
    // 17 Feb 2023 S. Baer
    // Custom linetypes were an experiment that ended up making the UI more complicated
    // than necessary. Do not write any custom linetype data into the 3dm file.
    //{
    //  const ON_Linetype* linetype = CustomLinetype();
    //  if (linetype)
    //  {
    //    c = ON_LayerTypeCodes::CustomLinetype; // 33
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = linetype->Write(file);
    //    if (!rc) break;
    //  }
    //}

    // visible in new detail (1.14)
    if (PerViewportIsVisibleInNewDetails() != DefaultLayerPrivate.m_visible_in_new_details)
    {
      c = ON_LayerTypeCodes::PerViewportIsVisibleInNewDetails; //34
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteBool(PerViewportIsVisibleInNewDetails());
      if (!rc) break;
    }

    if (section_style)
    {
      c = ON_LayerTypeCodes::CustomSectionStyle; //35
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = section_style->Write(file);
      if (!rc) break;
    }

    //if (m_private && false == m_private->m_clipplane_list_is_participation)
    //{
    //  c = ON_LayerTypeCodes::SelectiveClippingListType; //36
    //  rc = file.WriteChar(c);
    //  if (!rc) break;
    //  rc = file.WriteBool(m_private->m_clipplane_list_is_participation);
    //  if (!rc) break;
    //}

    // 0 indicates end of new non-default attributes
    c = 0;
    rc = file.WriteChar(c);

    break;
  }

  return rc;
}